

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_decompress1X1_DCtx_wksp
                 (HUF_DTable *DCtx,void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,
                 void *workSpace,size_t wkspSize)

{
  uint uVar1;
  size_t hSize;
  BYTE *ip;
  void *workSpace_local;
  size_t cSrcSize_local;
  void *cSrc_local;
  size_t dstSize_local;
  void *dst_local;
  HUF_DTable *DCtx_local;
  
  DCtx_local = (HUF_DTable *)HUF_readDTableX1_wksp(DCtx,cSrc,cSrcSize,workSpace,wkspSize);
  uVar1 = ERR_isError((size_t)DCtx_local);
  if (uVar1 == 0) {
    if (DCtx_local < cSrcSize) {
      DCtx_local = (HUF_DTable *)
                   HUF_decompress1X1_usingDTable_internal
                             (dst,dstSize,(void *)((long)DCtx_local + (long)cSrc),
                              cSrcSize - (long)DCtx_local,DCtx,0);
    }
    else {
      DCtx_local = (HUF_DTable *)0xffffffffffffffb8;
    }
  }
  return (size_t)DCtx_local;
}

Assistant:

size_t HUF_decompress1X1_DCtx_wksp(HUF_DTable* DCtx, void* dst, size_t dstSize,
                                   const void* cSrc, size_t cSrcSize,
                                   void* workSpace, size_t wkspSize)
{
    const BYTE* ip = (const BYTE*) cSrc;

    size_t const hSize = HUF_readDTableX1_wksp(DCtx, cSrc, cSrcSize, workSpace, wkspSize);
    if (HUF_isError(hSize)) return hSize;
    if (hSize >= cSrcSize) return ERROR(srcSize_wrong);
    ip += hSize; cSrcSize -= hSize;

    return HUF_decompress1X1_usingDTable_internal(dst, dstSize, ip, cSrcSize, DCtx, /* bmi2 */ 0);
}